

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCache.c
# Opt level: O0

void If_ManCacheAnalize(If_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int uUnique;
  int Entry;
  int i;
  Vec_Int_t *vTest [32];
  Vec_Int_t *vRes;
  If_Man_t *p_local;
  
  vTest[0x1f] = Hsh_IntManHashArray(p->vCutData,4);
  for (uUnique = 0; uUnique <= p->pPars->nLutSize; uUnique = uUnique + 1) {
    pVVar6 = Vec_IntAlloc(1000);
    *(Vec_Int_t **)(&Entry + (long)uUnique * 2) = pVVar6;
  }
  for (uUnique = 0; iVar1 = Vec_IntSize(vTest[0x1f]), uUnique < iVar1; uUnique = uUnique + 1) {
    iVar1 = Vec_IntEntry(vTest[0x1f],uUnique);
    iVar4 = Vec_IntEntry(p->vCutData,uUnique * 4 + 2);
    Vec_IntPush(*(Vec_Int_t **)(&Entry + (long)iVar4 * 2),iVar1);
  }
  for (uUnique = 0; uUnique <= p->pPars->nLutSize; uUnique = uUnique + 1) {
    uVar2 = Vec_IntCountUnique(*(Vec_Int_t **)(&Entry + (long)uUnique * 2));
    uVar3 = Vec_IntSize(*(Vec_Int_t **)(&Entry + (long)uUnique * 2));
    iVar1 = Vec_IntSize(*(Vec_Int_t **)(&Entry + (long)uUnique * 2));
    iVar4 = Vec_IntSize(vTest[0x1f]);
    iVar4 = Abc_MaxInt(1,iVar4);
    iVar5 = Vec_IntSize(*(Vec_Int_t **)(&Entry + (long)uUnique * 2));
    iVar5 = Abc_MaxInt(1,iVar5);
    printf("%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",
           ((double)iVar1 * 100.0) / (double)iVar4,((double)(int)uVar2 * 100.0) / (double)iVar5,
           (ulong)(uint)uUnique,(ulong)uVar3,(ulong)uVar2);
  }
  for (uUnique = 0; uUnique <= p->pPars->nLutSize; uUnique = uUnique + 1) {
    Vec_IntFree(*(Vec_Int_t **)(&Entry + (long)uUnique * 2));
  }
  uVar2 = Vec_IntCountUnique(vTest[0x1f]);
  iVar1 = Vec_IntSize(p->vCutData);
  iVar4 = Vec_IntSize(p->vCutData);
  iVar4 = Abc_MaxInt(1,iVar4 / 4);
  printf("Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",0x4059000000000000,
         ((double)(int)uVar2 * 100.0) / (double)iVar4,(ulong)(uint)(iVar1 / 4),(ulong)uVar2);
  Vec_IntFree(vTest[0x1f]);
  return;
}

Assistant:

void If_ManCacheAnalize( If_Man_t * p )
{
    Vec_Int_t * vRes, * vTest[32];
    int i, Entry, uUnique;
    vRes = Hsh_IntManHashArray( p->vCutData, 4 );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        vTest[i] = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRes, Entry, i )
        Vec_IntPush( vTest[Vec_IntEntry(p->vCutData, 4*i+2)], Entry );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
    {
        uUnique = Vec_IntCountUnique(vTest[i]);
        printf( "%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
            i, Vec_IntSize(vTest[i]), 100.0*Vec_IntSize(vTest[i])/Abc_MaxInt(1, Vec_IntSize(vRes)), 
            uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(vTest[i])) );
    }
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        Vec_IntFree( vTest[i] );
    uUnique = Vec_IntCountUnique(vRes);
    printf( "Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
        Vec_IntSize(p->vCutData)/4, 100.0, uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(p->vCutData)/4) );
    Vec_IntFree( vRes );
}